

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_reporter.c
# Opt level: O0

void cute_finish_test(TestReporter *reporter,char *filename,int line,char *message)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int line_00;
  char *in_RDI;
  TestReporter *unaff_retaddr;
  char *name;
  CuteMemo *memo;
  CgreenBreadcrumb *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  
  line_00 = (int)((ulong)in_RSI >> 0x20);
  puVar1 = *(undefined8 **)(in_RDI + 0x88);
  pcVar2 = get_current_from_breadcrumb(in_stack_ffffffffffffffc8);
  reporter_finish_test
            (unaff_retaddr,in_RDI,line_00,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  if (*(int *)(puVar1 + 2) == *(int *)(in_RDI + 0x54) + *(int *)(in_RDI + 0x58)) {
    (*(code *)*puVar1)("#success %s OK\n",pcVar2);
  }
  return;
}

Assistant:

static void cute_finish_test(TestReporter *reporter, const char *filename, int line, const char *message) {
    CuteMemo *memo = (CuteMemo *) reporter->memo;
    const char *name = get_current_from_breadcrumb((CgreenBreadcrumb *)reporter->breadcrumb);

    reporter_finish_test(reporter, filename, line, message);
    if (memo->error_count == reporter->failures + reporter->exceptions) {
        memo->printer("#success %s OK\n", name);
    }
}